

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbiftad.cpp
# Opt level: O3

void __thiscall RandStrLit::~RandStrLit(RandStrLit *this)

{
  RandStrNode *pRVar1;
  _func_int ***ppp_Var2;
  
  (this->super_RandStrNode)._vptr_RandStrNode = (_func_int **)&PTR__RandStrLit_0031d300;
  if (this->buf != (wchar_t *)0x0) {
    operator_delete__(this->buf);
  }
  (this->super_RandStrNode)._vptr_RandStrNode = (_func_int **)&PTR__RandStrNode_0031d240;
  pRVar1 = (this->super_RandStrNode).firstChild;
  while (pRVar1 != (RandStrNode *)0x0) {
    ppp_Var2 = &pRVar1->_vptr_RandStrNode;
    pRVar1 = pRVar1->nextSibling;
    (*(*ppp_Var2)[1])();
    (this->super_RandStrNode).firstChild = pRVar1;
  }
  return;
}

Assistant:

~RandStrLit()
    {
        delete [] buf;
    }